

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_Terminate(void)

{
  PaError PVar1;
  
  if (initializationCount_ == 0) {
    PVar1 = -10000;
  }
  else {
    initializationCount_ = initializationCount_ + -1;
    PVar1 = 0;
    if (initializationCount_ == 0) {
      while (firstOpenStream_ != (PaUtilStreamRepresentation *)0x0) {
        Pa_CloseStream(firstOpenStream_);
      }
      TerminateHostApis();
      PVar1 = 0;
    }
  }
  return PVar1;
}

Assistant:

PaError Pa_Terminate( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Terminate" );

    if( PA_IS_INITIALISED_ )
    {
        if( --initializationCount_ == 0 )
        {
            CloseOpenStreams();

            TerminateHostApis();

            PaUtil_DumpTraceMessages();
        }
        result = paNoError;
    }
    else
    {
        result=  paNotInitialized;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Terminate", result );

    return result;
}